

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transreg.cpp
# Opt level: O0

void __thiscall
icu_63::TransliteratorRegistry::registerEntry
          (TransliteratorRegistry *this,UnicodeString *source,UnicodeString *target,
          UnicodeString *variant,TransliteratorEntry *adopted,UBool visible)

{
  int32_t iVar1;
  ConstChar16Ptr local_d0 [3];
  undefined1 local_b8 [8];
  UnicodeString s;
  UnicodeString ID;
  UBool visible_local;
  TransliteratorEntry *adopted_local;
  UnicodeString *variant_local;
  UnicodeString *target_local;
  UnicodeString *source_local;
  TransliteratorRegistry *this_local;
  
  icu_63::UnicodeString::UnicodeString((UnicodeString *)((long)&s.fUnion + 0x30));
  icu_63::UnicodeString::UnicodeString((UnicodeString *)local_b8,source);
  iVar1 = icu_63::UnicodeString::length((UnicodeString *)local_b8);
  if (iVar1 == 0) {
    ConstChar16Ptr::ConstChar16Ptr(local_d0,L"Any");
    icu_63::UnicodeString::setTo((UnicodeString *)local_b8,'\x01',local_d0,3);
    ConstChar16Ptr::~ConstChar16Ptr(local_d0);
  }
  TransliteratorIDParser::STVtoID(source,target,variant,(UnicodeString *)((long)&s.fUnion + 0x30));
  registerEntry(this,(UnicodeString *)((long)&s.fUnion + 0x30),(UnicodeString *)local_b8,target,
                variant,adopted,visible);
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_b8);
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)((long)&s.fUnion + 0x30));
  return;
}

Assistant:

void TransliteratorRegistry::registerEntry(const UnicodeString& source,
                                           const UnicodeString& target,
                                           const UnicodeString& variant,
                                           TransliteratorEntry* adopted,
                                           UBool visible) {
    UnicodeString ID;
    UnicodeString s(source);
    if (s.length() == 0) {
        s.setTo(TRUE, ANY, 3);
    }
    TransliteratorIDParser::STVtoID(source, target, variant, ID);
    registerEntry(ID, s, target, variant, adopted, visible);
}